

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
UntypedPerformAction
          (FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
           *this,void *untyped_action,void *untyped_args)

{
  UntypedActionResultHolderBase *pUVar1;
  Action<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> action;
  _Any_data _Stack_48;
  _Manager_type local_38;
  ArgumentTuple local_28;
  
  std::function<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::function
            ((function<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *)
             &_Stack_48,
             (function<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *)
             untyped_action);
  local_28.super__Tuple_impl<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       *untyped_args;
  local_28.super__Tuple_impl<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long>.
  super__Head_base<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_false>._M_head_impl =
       *(vector<char,_std::allocator<char>_> **)((long)untyped_args + 8);
  Action<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::Perform
            ((Action<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *)
             &_Stack_48,&local_28);
  pUVar1 = (UntypedActionResultHolderBase *)operator_new(8);
  pUVar1->_vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002357c0;
  if (local_38 != (code *)0x0) {
    (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
  }
  return pUVar1;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }